

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O0

bool __thiscall
Refal2::CReceptacle::find
          (CReceptacle *this,CUnitNode *key,CUnitNode **leftBorderNode,CUnitNode **equalNode)

{
  bool bVar1;
  CNodeType *pCVar2;
  CUnitNode **ppCVar3;
  CNode<Refal2::CUnit> *pCVar4;
  byte local_46;
  byte local_45;
  int local_44;
  CNode<Refal2::CUnit> *pCStack_40;
  int depth;
  CUnitNode *burriedKeyNode;
  CUnitNode *keyNode;
  CUnitNode **equalNode_local;
  CUnitNode **leftBorderNode_local;
  CUnitNode *key_local;
  CReceptacle *this_local;
  
  pCVar2 = CNodeList<Refal2::CUnit>::GetFirst((CNodeList<Refal2::CUnit> *)this);
  *leftBorderNode = pCVar2;
  while( true ) {
    if (*leftBorderNode == (CUnitNode *)0x0) {
      *equalNode = (CUnitNode *)0x0;
      return false;
    }
    bVar1 = CUnit::IsLeftParen(&(*leftBorderNode)->super_CUnit);
    if (!bVar1) {
      __assert_fail("leftBorderNode->IsLeftParen()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                    ,0x76,
                    "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)")
      ;
    }
    pCStack_40 = CNode<Refal2::CUnit>::Next(*leftBorderNode);
    local_44 = 0;
    burriedKeyNode = key;
    while( true ) {
      local_45 = 0;
      if (burriedKeyNode != (CUnitNode *)0x0) {
        bVar1 = CUnit::IsEqualWith(&burriedKeyNode->super_CUnit,&pCStack_40->super_CUnit);
        local_45 = 0;
        if (bVar1) {
          local_46 = 1;
          if (local_44 < 1) {
            bVar1 = isEqualNode(burriedKeyNode);
            local_46 = bVar1 ^ 0xff;
          }
          local_45 = local_46;
        }
      }
      if ((local_45 & 1) == 0) break;
      bVar1 = CUnit::IsLeftParen(&burriedKeyNode->super_CUnit);
      if (bVar1) {
        local_44 = local_44 + 1;
      }
      else {
        bVar1 = CUnit::IsRightParen(&burriedKeyNode->super_CUnit);
        if (bVar1) {
          if (local_44 < 1) {
            __assert_fail("depth > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                          ,0x80,
                          "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                         );
          }
          local_44 = local_44 + -1;
        }
      }
      burriedKeyNode = CNode<Refal2::CUnit>::Next(burriedKeyNode);
      pCStack_40 = CNode<Refal2::CUnit>::Next(pCStack_40);
    }
    if (((burriedKeyNode == (CUnitNode *)0x0) || (bVar1 = isEqualNode(burriedKeyNode), bVar1)) &&
       (bVar1 = isEqualNode(pCStack_40), bVar1)) break;
    ppCVar3 = CUnit::PairedParen(&(*leftBorderNode)->super_CUnit);
    pCVar4 = CNode<Refal2::CUnit>::Next(*ppCVar3);
    *leftBorderNode = pCVar4;
  }
  if (local_44 == 0) {
    *equalNode = pCStack_40;
    return true;
  }
  __assert_fail("depth == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                ,0x89,
                "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)");
}

Assistant:

bool CReceptacle::find( const CUnitNode* key,
	CUnitNode*& leftBorderNode, CUnitNode*& equalNode )
{
	leftBorderNode = data.GetFirst();
	while( leftBorderNode != nullptr ) {
		assert( leftBorderNode->IsLeftParen() );
		const CUnitNode* keyNode = key;
		CUnitNode* burriedKeyNode = leftBorderNode->Next();
		int depth = 0;
		while( keyNode != nullptr && keyNode->IsEqualWith( *burriedKeyNode )
			&& ( depth > 0 || !isEqualNode( keyNode ) ) )
		{
			if( keyNode->IsLeftParen() ) {
				depth++;
			} else if( keyNode->IsRightParen() ) {
				assert( depth > 0 );
				depth--;
			}
			keyNode = keyNode->Next();
			burriedKeyNode = burriedKeyNode->Next();
		}
		if( ( keyNode == nullptr || isEqualNode( keyNode ) )
			&& isEqualNode( burriedKeyNode ) )
		{
			assert( depth == 0 );
			equalNode = burriedKeyNode;
			return true;
		}
		leftBorderNode = leftBorderNode->PairedParen()->Next();
	}
	equalNode = nullptr;
	return false;
}